

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall
opengv::absolute_pose::modules::Epnp::find_betas_approx_1
          (Epnp *this,Matrix<double,_6,_10,_0,_6,_10> *L_6x10,Matrix<double,_6,_1,_0,_6,_1> *Rho,
          double *betas)

{
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  VectorXd b4;
  VectorXd Rho_temp;
  MatrixXd L_6x4;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *local_250;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_248;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  
  SVD.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data._0_4_ = 6;
  Rho_temp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data._0_4_ = 4
  ;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&L_6x4,(int *)&SVD,(int *)&Rho_temp);
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 8) {
    *(undefined8 *)
     ((long)L_6x4.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
     + lVar1) = *(undefined8 *)
                 ((long)(L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).
                        m_storage.m_data.array + lVar1);
    *(undefined8 *)
     ((long)L_6x4.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
     + lVar1 + L_6x4.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows * 8) =
         *(undefined8 *)
          ((long)(L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.
                 m_data.array + lVar1 + 0x30);
    *(undefined8 *)
     ((long)L_6x4.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
     + lVar1 + L_6x4.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows * 0x10) =
         *(undefined8 *)
          ((long)(L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.
                 m_data.array + lVar1 + 0x90);
    *(undefined8 *)
     ((long)L_6x4.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
     + lVar1 + L_6x4.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows * 0x18) =
         *(undefined8 *)
          ((long)(L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.
                 m_data.array + lVar1 + 0x120);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD(&SVD,&L_6x4,0x14);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Rho_temp,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)Rho);
  local_250 = &SVD;
  local_248 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Rho_temp;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_1,_1,0,_1,_1>,2>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&b4,
             (DenseBase<Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_250);
  dVar2 = *b4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar2;
  if (0.0 <= dVar2) {
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      auVar3 = vsqrtsd_avx(auVar3,auVar3);
      dVar2 = auVar3._0_8_;
    }
    *betas = dVar2;
    betas[1] = b4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[1]
               / dVar2;
    betas[2] = b4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[2]
               / dVar2;
    dVar4 = b4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[3];
  }
  else {
    auVar5._0_8_ = -dVar2;
    auVar5._8_8_ = 0x8000000000000000;
    if (-0.0 < dVar2) {
      dVar2 = sqrt(auVar5._0_8_);
    }
    else {
      auVar3 = vsqrtsd_avx(auVar5,auVar5);
      dVar2 = auVar3._0_8_;
    }
    *betas = dVar2;
    betas[1] = -b4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                [1] / dVar2;
    betas[2] = -b4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                [2] / dVar2;
    dVar4 = -b4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[3];
  }
  betas[3] = dVar4 / dVar2;
  Eigen::internal::handmade_aligned_free
            (b4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            ((void *)CONCAT44(Rho_temp.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._4_4_,
                              Rho_temp.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._0_4_));
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&SVD);
  Eigen::internal::handmade_aligned_free
            (L_6x4.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
            );
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::find_betas_approx_1(
    const Eigen::Matrix<double,6,10> & L_6x10,
    const Eigen::Matrix<double,6,1> & Rho,
    double * betas)
{
  Eigen::MatrixXd L_6x4(6,4);

  for(int i = 0; i < 6; i++)
  {
    L_6x4(i,0) = L_6x10(i,0);
    L_6x4(i,1) = L_6x10(i,1);
    L_6x4(i,2) = L_6x10(i,3);
    L_6x4(i,3) = L_6x10(i,6);
  }

  Eigen::JacobiSVD<Eigen::MatrixXd> SVD(
      L_6x4,
      Eigen::ComputeFullV | Eigen::ComputeFullU);
  Eigen::VectorXd Rho_temp = Rho;
  Eigen::VectorXd b4 = SVD.solve(Rho_temp);

  if (b4[0] < 0)
  {
    betas[0] = sqrt(-b4[0]);
    betas[1] = -b4[1] / betas[0];
    betas[2] = -b4[2] / betas[0];
    betas[3] = -b4[3] / betas[0];
  }
  else
  {
    betas[0] = sqrt(b4[0]);
    betas[1] = b4[1] / betas[0];
    betas[2] = b4[2] / betas[0];
    betas[3] = b4[3] / betas[0];
  }
}